

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_sig.c
# Opt level: O0

err_t cmdSigPrint(char *sig_name,char *scope)

{
  bool_t bVar1;
  err_t eVar2;
  int iVar3;
  char *sig_name_00;
  cmd_sig_t *in_RSI;
  cmd_sig_t *sig;
  void *stack;
  err_t code;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  char *in_stack_ffffffffffffffd0;
  char *buf;
  uint in_stack_ffffffffffffffe0;
  err_t local_4;
  
  bVar1 = strIsValid(in_stack_ffffffffffffffd0);
  if ((bVar1 == 0) ||
     ((in_RSI != (cmd_sig_t *)0x0 && (bVar1 = strIsValid(in_stack_ffffffffffffffd0), bVar1 == 0))))
  {
    local_4 = 0x6d;
  }
  else {
    sig_name_00 = (char *)blobCreate(CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    local_4 = 0x6e;
    if (sig_name_00 != (char *)0x0) {
      local_4 = 0;
    }
    if (local_4 == 0) {
      buf = sig_name_00;
      local_4 = cmdSigRead(in_RSI,(size_t *)(ulong)in_stack_ffffffffffffffe0,sig_name_00);
      if (local_4 == 0) {
        if (in_RSI == (cmd_sig_t *)0x0) {
          printf("certc: ");
          eVar2 = cmdSigPrintCertc(in_RSI);
          if (eVar2 != 0) {
            return eVar2;
          }
          bVar1 = memIsZero(sig_name_00 + 0x628,6);
          if (bVar1 == 0) {
            printf("\ndate:  ");
            eVar2 = cmdPrintDate((octet *)CONCAT44(in_stack_ffffffffffffffcc,
                                                   in_stack_ffffffffffffffc8));
            if (eVar2 != 0) {
              return eVar2;
            }
          }
          printf("\nsig:   ");
          local_4 = cmdPrintMem2(buf,(size_t)sig_name_00);
        }
        else {
          iVar3 = strCmp(sig_name_00,
                         (char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
          if (iVar3 == 0) {
            local_4 = cmdSigPrintCertc(in_RSI);
          }
          else {
            iVar3 = strCmp(sig_name_00,
                           (char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
            if (iVar3 == 0) {
              bVar1 = memIsZero(sig_name_00 + 0x628,6);
              if (bVar1 == 0) {
                local_4 = cmdPrintDate((octet *)CONCAT44(in_stack_ffffffffffffffcc,
                                                         in_stack_ffffffffffffffc8));
              }
              else {
                local_4 = 0x134;
              }
            }
            else {
              iVar3 = strCmp(sig_name_00,
                             (char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
              if (iVar3 == 0) {
                local_4 = cmdPrintMem(buf,(size_t)sig_name_00);
              }
              else {
                local_4 = 0x25b;
              }
            }
          }
        }
        if (local_4 == 0) {
          printf("\n");
          blobClose((blob_t)0x10ad86);
        }
        else {
          blobClose((blob_t)0x10ad64);
        }
      }
      else {
        blobClose((blob_t)0x10abcb);
      }
    }
  }
  return local_4;
}

Assistant:

err_t cmdSigPrint(const char* sig_name, const char* scope)
{
	err_t code;
	void* stack;
	cmd_sig_t* sig;
	// входной контроль
	if (!strIsValid(sig_name) || !strIsNullOrValid(scope))
		return ERR_BAD_INPUT;
	// выделить и разметить память
	code = cmdBlobCreate(stack, sizeof(cmd_sig_t));
	ERR_CALL_CHECK(code);
	sig = (cmd_sig_t*)stack;
	// читать подпись
	code = cmdSigRead(sig, 0, sig_name);
	ERR_CALL_HANDLE(code, cmdBlobClose(stack));
	// печать всех полей
	if (scope == 0)
	{
		printf("certc: ");
		code = cmdSigPrintCertc(sig);
		ERR_CALL_CHECK(code);
		if (!memIsZero(sig->date, 6))
		{
			printf("\ndate:  ");
			code = cmdPrintDate(sig->date);
			ERR_CALL_CHECK(code);
		}
		printf("\nsig:   ");
		code = cmdPrintMem2(sig->sig, sig->sig_len);
	}
	// печать отдельных полей
	else if (strEq(scope, "certc"))
		code = cmdSigPrintCertc(sig);
	else if (strEq(scope, "date"))
		code = memIsZero(sig->date, 6) ?
			ERR_BAD_DATE : cmdPrintDate(sig->date);
	else if (strEq(scope, "sig"))
		code = cmdPrintMem(sig->sig, sig->sig_len);
	else
		code = ERR_CMD_PARAMS;
	// завершить
	ERR_CALL_HANDLE(code, cmdBlobClose(stack));
	printf("\n");
	cmdBlobClose(stack);
	return code;
}